

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *pAVar1;
  FileDescriptorProto *from;
  uint uVar2;
  FileDescriptorProto *to;
  ulong uVar3;
  long lVar4;
  
  uVar2 = length;
  if (already_allocated < length) {
    uVar2 = already_allocated;
  }
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      GenericTypeHandler<google::protobuf::FileDescriptorProto>::Merge
                ((FileDescriptorProto *)other_elems[uVar3],(FileDescriptorProto *)our_elems[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (already_allocated < length) {
    pAVar1 = this->arena_;
    lVar4 = 0;
    do {
      from = (FileDescriptorProto *)other_elems[already_allocated + lVar4];
      to = google::protobuf::Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>
                     (pAVar1);
      GenericTypeHandler<google::protobuf::FileDescriptorProto>::Merge(from,to);
      our_elems[already_allocated + lVar4] = to;
      lVar4 = lVar4 + 1;
    } while (length - already_allocated != (int)lVar4);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArena();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}